

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_Buffer.cc
# Opt level: O0

void __thiscall Pl_Buffer::Pl_Buffer(Pl_Buffer *this,char *identifier,Pipeline *next)

{
  Pipeline *next_local;
  char *identifier_local;
  Pl_Buffer *this_local;
  
  Pipeline::Pipeline(&this->super_Pipeline,identifier,next);
  (this->super_Pipeline)._vptr_Pipeline = (_func_int **)&PTR__Pl_Buffer_0058c100;
  std::make_unique<Pl_Buffer::Members>();
  return;
}

Assistant:

Pl_Buffer::Pl_Buffer(char const* identifier, Pipeline* next) :
    Pipeline(identifier, next),
    m(std::make_unique<Members>())
{
}